

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_image_rotate_cw_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,void *dst,rf_int dst_size)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  void *__src;
  void *pvVar10;
  void *__dest;
  long lVar11;
  ulong __n;
  bool bVar12;
  
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  if (image.valid == true) {
    iVar2 = rf_pixel_buffer_size(image.width,image.height,image.format);
    if (iVar2 <= dst_size) {
      lVar8 = (long)image.width;
      lVar9 = (long)image.height;
      uVar3 = rf_bytes_per_pixel(image.format);
      __n = (ulong)uVar3;
      lVar6 = 0;
      lVar4 = 0;
      if (0 < lVar8) {
        lVar4 = lVar8;
      }
      lVar5 = 0;
      if (0 < lVar9) {
        lVar5 = lVar9;
      }
      pvVar10 = (void *)((lVar9 + -1) * __n + (long)dst);
      pvVar7 = image.data;
      while( true ) {
        __src = pvVar7;
        __dest = pvVar10;
        lVar11 = lVar4;
        if (lVar6 == lVar5) break;
        while (bVar12 = lVar11 != 0, lVar11 = lVar11 + -1, bVar12) {
          memcpy(__dest,__src,__n);
          __dest = (void *)((long)__dest + lVar9 * __n);
          __src = (void *)((long)__src + __n);
        }
        lVar6 = lVar6 + 1;
        pvVar10 = (void *)((long)pvVar10 - __n);
        pvVar7 = (void *)((long)pvVar7 + lVar8 * __n);
      }
      __return_storage_ptr__->data = image.data;
      __return_storage_ptr__->width = (int)image._8_8_;
      __return_storage_ptr__->height = (int)((ulong)image._8_8_ >> 0x20);
      uVar1 = image._16_8_;
      __return_storage_ptr__->format = (int)uVar1;
      __return_storage_ptr__->valid = (_Bool)(char)((ulong)uVar1 >> 0x20);
      *(int3 *)&__return_storage_ptr__->field_0x15 = (int3)((ulong)uVar1 >> 0x28);
      __return_storage_ptr__->data = dst;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_rotate_cw_to_buffer(rf_image image, void* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (image.valid)
    {
        if (dst_size >= rf_image_size(image))
        {
            int bpp = rf_bytes_per_pixel(image.format);

            for (rf_int y = 0; y < image.height; y++)
            {
                for (rf_int x = 0; x < image.width; x++)
                {
                    void* dst_pixel = ((unsigned char*)dst) + (x * image.height + (image.height - y - 1)) * bpp;
                    void* src_pixel = ((unsigned char*)image.data) + (y * image.width + x) * bpp;

                    memcpy(dst_pixel, src_pixel, bpp);
                }
            }

            result = image;
            result.data = dst;
        }
    }

    return result;
}